

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry
          (Status *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer,Mesh *out_geometry)

{
  Status *_local_status;
  
  DecodeBufferToGeometryStep1(__return_storage_ptr__,this,in_buffer,out_geometry);
  if (__return_storage_ptr__->code_ == OK) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
    DecodeBufferToGeometryStep2(__return_storage_ptr__,this);
    if (__return_storage_ptr__->code_ == OK) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       Mesh *out_geometry) {
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometryStep1(in_buffer,out_geometry))
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometryStep2())
  return OkStatus();
}